

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O2

char * kws_search_get_keyphrases(ps_search_t *search)

{
  char *pcVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  char **ppcVar5;
  int iVar6;
  char **ppcVar7;
  
  iVar6 = 0;
  ppcVar5 = &search[1].type;
  ppcVar7 = ppcVar5;
  while (pcVar3 = *ppcVar7, pcVar3 != (char *)0x0) {
    sVar2 = strlen((char *)**(undefined8 **)pcVar3);
    iVar6 = iVar6 + (int)sVar2 + 1;
    ppcVar7 = (char **)(pcVar3 + 8);
  }
  pcVar3 = (char *)__ckd_calloc__((long)iVar6,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
                                  ,0x2bd);
  iVar6 = 0;
  while( true ) {
    pcVar1 = *ppcVar5;
    if (pcVar1 == (char *)0x0) break;
    __s = (char *)**(undefined8 **)pcVar1;
    sVar2 = strlen(__s);
    memcpy(pcVar3 + iVar6,__s,sVar2);
    sVar2 = strlen(__s);
    iVar4 = iVar6 + (int)sVar2;
    iVar6 = (int)sVar2 + iVar6 + 1;
    pcVar3[iVar4] = '\n';
    ppcVar5 = (char **)(pcVar1 + 8);
  }
  pcVar3[(long)iVar6 + -1] = '\0';
  return pcVar3;
}

Assistant:

char * 
kws_search_get_keyphrases(ps_search_t * search)
{
    int c, len;
    kws_search_t *kwss;
    char* line;
    gnode_t *gn;

    kwss = (kws_search_t *) search;

    len = 0;
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn))
        len += strlen(((kws_keyphrase_t *)gnode_ptr(gn))->word) + 1;

    c = 0;
    line = (char *)ckd_calloc(len, sizeof(*line));
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn)) {
        const char *str = ((kws_keyphrase_t *)gnode_ptr(gn))->word;
        memcpy(&line[c], str, strlen(str));
        c += strlen(str);
        line[c++] = '\n';
    }
    line[--c] = '\0';

    return line;
}